

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O0

void ztimer::SleepMs(uint t)

{
  int iVar1;
  int *piVar2;
  uint in_EDI;
  bool bVar3;
  timespec ts;
  timespec local_18;
  
  local_18.tv_sec = (ulong)in_EDI / 1000;
  local_18.tv_nsec = ((ulong)in_EDI % 1000) * 1000000;
  do {
    iVar1 = nanosleep(&local_18,&local_18);
    bVar3 = false;
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  return;
}

Assistant:

inline void SleepMs(unsigned int t)  // 毫秒级延时
    {
#ifdef OS_LINUX
        timespec ts;
        ts.tv_sec = t / 1000;
        ts.tv_nsec = (1000000L * (t % 1000));
        while (nanosleep(&ts, &ts) < 0 && errno == EINTR) {}
#else
        std::this_thread::sleep_for(std::chrono::milliseconds(t));
#endif
    }